

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O1

void __thiscall
soplex::SPxEquiliSC<double>::scale(SPxEquiliSC<double> *this,SPxLPBase<double> *lp,bool persistent)

{
  SPxOut *pSVar1;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  char cVar2;
  DataArray<int> **ppDVar3;
  DataArray<int> **ppDVar4;
  long lVar5;
  char *pcVar6;
  SPxLPBase<double> *vecset;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  Verbosity old_verbosity;
  Verbosity local_4c;
  Real local_48;
  double local_40;
  double local_38;
  
  pSVar1 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (2 < (int)pSVar1->m_verbosity)) {
    local_4c = pSVar1->m_verbosity;
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],"Equilibrium scaling LP",0x16);
    pcVar6 = "";
    if (persistent) {
      pcVar6 = " (persistent)";
    }
    lVar5 = 0xd;
    if (!persistent) {
      lVar5 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],pcVar6,lVar5);
    cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_4c);
  }
  (**(this->super_SPxScaler<double>)._vptr_SPxScaler)(this,lp);
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
  local_38 = extraout_XMM0_Qa;
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
  this_00 = (this->super_SPxScaler<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_SPxScaler<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_40 = extraout_XMM0_Qa_00;
  local_48 = Tolerances::epsilon(this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pSVar1 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (3 < (int)pSVar1->m_verbosity)) {
    local_4c = pSVar1->m_verbosity;
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],"before scaling:",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," min= ",6);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,1);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," max= ",6);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,1);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_02);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," col-ratio= ",0xc);
    std::ostream::_M_insert<double>(local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," row-ratio= ",0xc);
    std::ostream::_M_insert<double>(local_40);
    cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_4c);
  }
  if (local_40 <= local_38) {
    computeEquiExpVec((SVSetBase<double> *)lp,(this->super_SPxScaler<double>).m_activeColscaleExp,
                      (this->super_SPxScaler<double>).m_activeRowscaleExp,local_48);
    if ((this->super_SPxScaler<double>).m_doBoth != true) goto LAB_00202ef1;
    ppDVar3 = &(this->super_SPxScaler<double>).m_activeColscaleExp;
    ppDVar4 = &(this->super_SPxScaler<double>).m_activeRowscaleExp;
    vecset = (SPxLPBase<double> *)&lp->super_LPColSetBase<double>;
  }
  else {
    computeEquiExpVec(&(lp->super_LPColSetBase<double>).super_SVSetBase<double>,
                      (this->super_SPxScaler<double>).m_activeRowscaleExp,
                      (this->super_SPxScaler<double>).m_activeColscaleExp,local_48);
    if ((this->super_SPxScaler<double>).m_doBoth == false) goto LAB_00202ef1;
    ppDVar3 = &(this->super_SPxScaler<double>).m_activeRowscaleExp;
    ppDVar4 = &(this->super_SPxScaler<double>).m_activeColscaleExp;
    vecset = lp;
  }
  computeEquiExpVec((SVSetBase<double> *)vecset,*ppDVar4,*ppDVar3,local_48);
LAB_00202ef1:
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[2])(this,lp);
  pSVar1 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (local_4c = pSVar1->m_verbosity, 4 < (int)local_4c)) {
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],"Row scaling min= ",0x11);
    (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x31])(this);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_03);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," max= ",6);
    (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x32])(this);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_04);
    cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],"Col scaling min= ",0x11);
    (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x2f])(this);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_05);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," max= ",6);
    (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x30])(this);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_06);
    cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_4c);
  }
  pSVar1 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (local_4c = pSVar1->m_verbosity, 3 < (int)local_4c)) {
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],"after scaling: ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," min= ",6);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,0);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_07);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," max= ",6);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,0);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_08);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," col-ratio= ",0xc);
    (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_09);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity]," row-ratio= ",0xc);
    (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_10);
    cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    pSVar1 = (this->super_SPxScaler<double>).spxout;
    (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_4c);
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Equilibrium scaling LP" <<
                 (persistent ? " (persistent)" : "") << std::endl;)

   this->setup(lp);

   /* We want to do the direction first, which has a lower maximal ratio,
    * since the lowest value in the scaled matrix is bounded from below by
    * the inverse of the maximum ratio of the direction that is done first
    * Example:
    *
    *                     Rowratio
    *            0.1  1   10
    *            10   1   10
    *
    * Colratio   100  1
    *
    * Row first =>         Col next =>
    *            0.1  1          0.1  1
    *            1    0.1        1    0.1
    *
    * Col first =>         Row next =>
    *            0.01 1          0.01 1
    *            1    1          1    1
    *
    */
   R colratio = this->maxColRatio(lp);
   R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   bool colFirst = colratio < rowratio;

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);
   }

   /* scale */
   this->applyScaling(lp);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                 << " max= " << this->maxAbsRowscale()
                 << std::endl
                 << "Col scaling min= " << this->minAbsColscale()
                 << " max= " << this->maxAbsColscale()
                 << std::endl;)

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                 << " min= " << lp.minAbsNzo(false)
                 << " max= " << lp.maxAbsNzo(false)
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)

}